

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cxx
# Opt level: O2

int main(void)

{
  allocator<char> local_3fa;
  allocator<char> local_3f9;
  string local_3f8;
  string local_3d8;
  _Any_data local_3b8;
  code *local_3a8;
  code *local_3a0;
  _Any_data local_398;
  code *local_388;
  code *local_380;
  _Any_data local_378;
  code *local_368;
  code *local_360;
  _Any_data local_358;
  code *local_348;
  code *local_340;
  _Any_data local_338;
  code *local_328;
  code *local_320;
  _Any_data local_318;
  code *local_308;
  code *local_300;
  server_t s;
  
  clask::server_t::server_t(&s);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f8,"/",(allocator<char> *)&local_3d8);
  local_318._M_unused._M_object = (void *)0x0;
  local_318._8_8_ = 0;
  local_300 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/main.cxx:6:14)>
              ::_M_invoke;
  local_308 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/main.cxx:6:14)>
              ::_M_manager;
  clask::server_t::GET(&s,&local_3f8,(functor_string *)&local_318);
  std::_Function_base::~_Function_base((_Function_base *)&local_318);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f8,"/notfound",(allocator<char> *)&local_3d8);
  local_338._M_unused._M_object = (void *)0x0;
  local_338._8_8_ = 0;
  local_320 = std::
              _Function_handler<void_(clask::response_writer_&,_clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/main.cxx:9:22)>
              ::_M_invoke;
  local_328 = std::
              _Function_handler<void_(clask::response_writer_&,_clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/main.cxx:9:22)>
              ::_M_manager;
  clask::server_t::GET(&s,&local_3f8,(functor_writer *)&local_338);
  std::_Function_base::~_Function_base((_Function_base *)&local_338);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f8,"/foo",(allocator<char> *)&local_3d8);
  local_358._M_unused._M_object = (void *)0x0;
  local_358._8_8_ = 0;
  local_340 = std::
              _Function_handler<void_(clask::response_writer_&,_clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/main.cxx:14:17)>
              ::_M_invoke;
  local_348 = std::
              _Function_handler<void_(clask::response_writer_&,_clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/main.cxx:14:17)>
              ::_M_manager;
  clask::server_t::GET(&s,&local_3f8,(functor_writer *)&local_358);
  std::_Function_base::~_Function_base((_Function_base *)&local_358);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f8,"/zoo/:name",(allocator<char> *)&local_3d8);
  local_378._M_unused._M_object = (void *)0x0;
  local_378._8_8_ = 0;
  local_360 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/main.cxx:19:23)>
              ::_M_invoke;
  local_368 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/main.cxx:19:23)>
              ::_M_manager;
  clask::server_t::GET(&s,&local_3f8,(functor_string *)&local_378);
  std::_Function_base::~_Function_base((_Function_base *)&local_378);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f8,"/download",(allocator<char> *)&local_3d8);
  local_398._M_unused._M_object = (void *)0x0;
  local_398._8_8_ = 0;
  local_380 = std::
              _Function_handler<void_(clask::response_writer_&,_clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/main.cxx:23:22)>
              ::_M_invoke;
  local_388 = std::
              _Function_handler<void_(clask::response_writer_&,_clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/main.cxx:23:22)>
              ::_M_manager;
  clask::server_t::GET(&s,&local_3f8,(functor_writer *)&local_398);
  std::_Function_base::~_Function_base((_Function_base *)&local_398);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f8,"/bar",(allocator<char> *)&local_3d8);
  local_3b8._M_unused._M_object = (void *)0x0;
  local_3b8._8_8_ = 0;
  local_3a0 = std::
              _Function_handler<clask::response_(clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/main.cxx:34:17)>
              ::_M_invoke;
  local_3a8 = std::
              _Function_handler<clask::response_(clask::request_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mattn[P]clask/main.cxx:34:17)>
              ::_M_manager;
  clask::server_t::GET(&s,&local_3f8,(functor_response *)&local_3b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f8,"/static/",&local_3f9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d8,"./public",&local_3fa);
  clask::server_t::static_dir(&s,&local_3f8,&local_3d8,true);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_3f8);
  clask::server_t::run(&s,0x1f90);
  clask::server_t::~server_t(&s);
  return 0;
}

Assistant:

int main() {
  auto s = clask::server();
  s.GET("/", [](clask::request&) {
    return "OK!";
  });
  s.GET("/notfound", [](clask::response_writer& resp, clask::request&) {
    resp.code = 404;
    resp.set_header("content-type", "text/html");
    resp.write("Not Found");
  });
  s.GET("/foo", [](clask::response_writer& resp, clask::request&) {
    resp.set_header("content-type", "text/html");
    resp.write("he<b>l</b>lo");
    resp.end();
  });
  s.GET("/zoo/:name", [](clask::request& req) -> std::string {
    if (req.args.empty() || req.args[0].empty()) return "Wow!";
    return req.args[0];
  });
  s.GET("/download", [](clask::response_writer& resp, clask::request&) {
    resp.set_header("content-type", "application/octet-stream");
    resp.set_header("content-disposition", "attachment; filename=README.md");
    std::ifstream is("README.md", std::ios::in | std::ios::binary);
    char buf[BUFSIZ];
    while (!is.eof()) {
      auto size = is.read(buf, sizeof(buf)).gcount();
      resp.write(buf, (size_t) size);
    }
    resp.end();
  });
  s.GET("/bar", [](clask::request&) -> clask::response {
    return clask::response {
      .code = 200,
      .content = "hello",
      .headers = {
        { "X-Host", "hogehoge" },
      },
    };
  });
  s.static_dir("/static/", "./public", true);
  s.run();
}